

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-test.c++
# Opt level: O3

void __thiscall kj::_::anon_unknown_0::TestCase168::run(TestCase168 *this)

{
  char *pcVar1;
  size_t sVar2;
  bool result;
  bool bVar3;
  DebugComparison<kj::Maybe<double>,_double> _kjCondition;
  undefined1 local_98;
  anon_union_1_1_a8c68091_for_NullableValue<unsigned_char>_2 local_97;
  anon_union_2_1_a8c68091_for_NullableValue<unsigned_short>_2 local_96;
  anon_union_4_1_a8c68091_for_NullableValue<float>_2 local_94;
  anon_union_8_1_a8c68091_for_NullableValue<double>_2 local_90;
  undefined8 local_88;
  char *local_80;
  size_t local_78;
  bool local_70;
  undefined1 local_68 [2];
  anon_union_2_1_a8c68091_for_NullableValue<unsigned_short>_2 aStack_66;
  anon_union_4_1_a8c68091_for_NullableValue<float>_2 aStack_64;
  size_t local_60;
  String local_58;
  undefined1 local_40 [8];
  char *local_38;
  
  _local_68 = "0";
  local_60 = 2;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 0) {
    local_70 = false;
joined_r0x0013541b:
    local_78 = 5;
    local_80 = " == ";
    local_88 = (char *)0x0;
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88 = (char *)0x0;
      Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<double>,double>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xa9,ERROR,
                 "\"failed: expected \" \"\\\"0\\\"_kj.tryParseAs<double>() == 0.0\", _kjCondition",
                 (char (*) [52])"failed: expected \"0\"_kj.tryParseAs<double>() == 0.0",
                 (DebugComparison<kj::Maybe<double>,_double> *)&local_98);
    }
  }
  else {
    local_70 = (double)local_58.content.size_ == 0.0;
    local_90.value = (double)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88 = (char *)0x0;
    local_80 = " == ";
    local_78 = 5;
    if (((double)local_58.content.size_ != 0.0) || (NAN((double)local_58.content.size_)))
    goto joined_r0x0013541b;
  }
  _local_68 = "0";
  local_60 = 2;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 0) {
    local_70 = false;
joined_r0x001354f5:
    local_78 = 5;
    local_80 = " == ";
    local_88 = (char *)0x0;
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88 = (char *)0x0;
      Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<double>,double>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xaa,ERROR,
                 "\"failed: expected \" \"\\\"0\\\"_kj.tryParseAs<double>() == 0.0\", _kjCondition",
                 (char (*) [52])"failed: expected \"0\"_kj.tryParseAs<double>() == 0.0",
                 (DebugComparison<kj::Maybe<double>,_double> *)&local_98);
    }
  }
  else {
    local_70 = (double)local_58.content.size_ == 0.0;
    local_90.value = (double)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88 = (char *)0x0;
    local_80 = " == ";
    local_78 = 5;
    if (((double)local_58.content.size_ != 0.0) || (NAN((double)local_58.content.size_)))
    goto joined_r0x001354f5;
  }
  _local_68 = "0.0";
  local_60 = 4;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 0) {
    local_70 = false;
joined_r0x001355cf:
    local_78 = 5;
    local_80 = " == ";
    local_88 = (char *)0x0;
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88 = (char *)0x0;
      Debug::log<char_const(&)[54],kj::_::DebugComparison<kj::Maybe<double>,double>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xab,ERROR,
                 "\"failed: expected \" \"\\\"0.0\\\"_kj.tryParseAs<double>() == 0.0\", _kjCondition"
                 ,(char (*) [54])"failed: expected \"0.0\"_kj.tryParseAs<double>() == 0.0",
                 (DebugComparison<kj::Maybe<double>,_double> *)&local_98);
    }
  }
  else {
    local_70 = (double)local_58.content.size_ == 0.0;
    local_90.value = (double)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88 = (char *)0x0;
    local_80 = " == ";
    local_78 = 5;
    if (((double)local_58.content.size_ != 0.0) || (NAN((double)local_58.content.size_)))
    goto joined_r0x001355cf;
  }
  _local_68 = "1";
  local_60 = 2;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 0) {
    local_70 = false;
joined_r0x001356af:
    local_78 = 5;
    local_80 = " == ";
    local_88 = (char *)0x3ff0000000000000;
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88 = (char *)0x3ff0000000000000;
      Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<double>,double>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xac,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<double>() == 1.0\", _kjCondition",
                 (char (*) [52])"failed: expected \"1\"_kj.tryParseAs<double>() == 1.0",
                 (DebugComparison<kj::Maybe<double>,_double> *)&local_98);
    }
  }
  else {
    local_70 = (double)local_58.content.size_ == 1.0;
    local_90.value = (double)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88 = (char *)0x3ff0000000000000;
    local_80 = " == ";
    local_78 = 5;
    if (((double)local_58.content.size_ != 1.0) || (NAN((double)local_58.content.size_)))
    goto joined_r0x001356af;
  }
  _local_68 = "1.0";
  local_60 = 4;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 0) {
    local_70 = false;
joined_r0x00135785:
    local_78 = 5;
    local_80 = " == ";
    local_88 = (char *)0x3ff0000000000000;
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88 = (char *)0x3ff0000000000000;
      Debug::log<char_const(&)[54],kj::_::DebugComparison<kj::Maybe<double>,double>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xad,ERROR,
                 "\"failed: expected \" \"\\\"1.0\\\"_kj.tryParseAs<double>() == 1.0\", _kjCondition"
                 ,(char (*) [54])"failed: expected \"1.0\"_kj.tryParseAs<double>() == 1.0",
                 (DebugComparison<kj::Maybe<double>,_double> *)&local_98);
    }
  }
  else {
    local_70 = (double)local_58.content.size_ == 1.0;
    local_90.value = (double)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88 = (char *)0x3ff0000000000000;
    local_80 = " == ";
    local_78 = 5;
    if (((double)local_58.content.size_ != 1.0) || (NAN((double)local_58.content.size_)))
    goto joined_r0x00135785;
  }
  _local_68 = "1e100";
  local_60 = 6;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 0) {
    local_70 = false;
joined_r0x00135868:
    local_78 = 5;
    local_80 = " == ";
    local_88 = (char *)0x54b249ad2594c37d;
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88 = (char *)0x54b249ad2594c37d;
      Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<double>,double>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xae,ERROR,
                 "\"failed: expected \" \"\\\"1e100\\\"_kj.tryParseAs<double>() == 1e100\", _kjCondition"
                 ,(char (*) [58])"failed: expected \"1e100\"_kj.tryParseAs<double>() == 1e100",
                 (DebugComparison<kj::Maybe<double>,_double> *)&local_98);
    }
  }
  else {
    local_70 = (double)local_58.content.size_ == 1e+100;
    local_90.value = (double)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88 = (char *)0x54b249ad2594c37d;
    local_80 = " == ";
    local_78 = 5;
    if (((double)local_58.content.size_ != 1e+100) || (NAN((double)local_58.content.size_)))
    goto joined_r0x00135868;
  }
  _local_68 = "inf";
  local_60 = 4;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 0) {
    local_70 = false;
joined_r0x00135933:
    local_88._0_4_ = INFINITY;
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88._0_4_ = INFINITY;
      Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<double>,float>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xaf,ERROR,
                 "\"failed: expected \" \"\\\"inf\\\"_kj.tryParseAs<double>() == inf()\", _kjCondition"
                 ,(char (*) [56])"failed: expected \"inf\"_kj.tryParseAs<double>() == inf()",
                 (DebugComparison<kj::Maybe<double>,_float> *)&local_98);
    }
  }
  else {
    local_70 = INFINITY <= (double)local_58.content.size_;
    local_90.value = (double)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88._0_4_ = INFINITY;
    local_80 = " == ";
    local_78 = 5;
    if (!local_70) goto joined_r0x00135933;
  }
  _local_68 = "infinity";
  local_60 = 9;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 0) {
    local_70 = false;
joined_r0x001359fe:
    local_88._0_4_ = INFINITY;
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88._0_4_ = INFINITY;
      Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<double>,float>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xb0,ERROR,
                 "\"failed: expected \" \"\\\"infinity\\\"_kj.tryParseAs<double>() == inf()\", _kjCondition"
                 ,(char (*) [61])"failed: expected \"infinity\"_kj.tryParseAs<double>() == inf()",
                 (DebugComparison<kj::Maybe<double>,_float> *)&local_98);
    }
  }
  else {
    local_70 = INFINITY <= (double)local_58.content.size_;
    local_90.value = (double)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88._0_4_ = INFINITY;
    local_80 = " == ";
    local_78 = 5;
    if (!local_70) goto joined_r0x001359fe;
  }
  _local_68 = "INF";
  local_60 = 4;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 0) {
    local_70 = false;
joined_r0x00135ac9:
    local_88._0_4_ = INFINITY;
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88._0_4_ = INFINITY;
      Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<double>,float>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xb1,ERROR,
                 "\"failed: expected \" \"\\\"INF\\\"_kj.tryParseAs<double>() == inf()\", _kjCondition"
                 ,(char (*) [56])"failed: expected \"INF\"_kj.tryParseAs<double>() == inf()",
                 (DebugComparison<kj::Maybe<double>,_float> *)&local_98);
    }
  }
  else {
    local_70 = INFINITY <= (double)local_58.content.size_;
    local_90.value = (double)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88._0_4_ = INFINITY;
    local_80 = " == ";
    local_78 = 5;
    if (!local_70) goto joined_r0x00135ac9;
  }
  _local_68 = "INFINITY";
  local_60 = 9;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 0) {
    local_70 = false;
joined_r0x00135b94:
    local_88._0_4_ = INFINITY;
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88._0_4_ = INFINITY;
      Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<double>,float>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xb2,ERROR,
                 "\"failed: expected \" \"\\\"INFINITY\\\"_kj.tryParseAs<double>() == inf()\", _kjCondition"
                 ,(char (*) [61])"failed: expected \"INFINITY\"_kj.tryParseAs<double>() == inf()",
                 (DebugComparison<kj::Maybe<double>,_float> *)&local_98);
    }
  }
  else {
    local_70 = INFINITY <= (double)local_58.content.size_;
    local_90.value = (double)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88._0_4_ = INFINITY;
    local_80 = " == ";
    local_78 = 5;
    if (!local_70) goto joined_r0x00135b94;
  }
  _local_68 = "1e100000";
  local_60 = 9;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 0) {
    local_70 = false;
joined_r0x00135c5f:
    local_88._0_4_ = INFINITY;
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88._0_4_ = INFINITY;
      Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<double>,float>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xb3,ERROR,
                 "\"failed: expected \" \"\\\"1e100000\\\"_kj.tryParseAs<double>() == inf()\", _kjCondition"
                 ,(char (*) [61])"failed: expected \"1e100000\"_kj.tryParseAs<double>() == inf()",
                 (DebugComparison<kj::Maybe<double>,_float> *)&local_98);
    }
  }
  else {
    local_70 = INFINITY <= (double)local_58.content.size_;
    local_90.value = (double)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88._0_4_ = INFINITY;
    local_80 = " == ";
    local_78 = 5;
    if (!local_70) goto joined_r0x00135c5f;
  }
  _local_68 = "-inf";
  local_60 = 5;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 0) {
    local_70 = false;
joined_r0x00135d2e:
    local_88._0_4_ = -INFINITY;
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88._0_4_ = -INFINITY;
      Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<double>,float>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xb4,ERROR,
                 "\"failed: expected \" \"\\\"-inf\\\"_kj.tryParseAs<double>() == -inf()\", _kjCondition"
                 ,(char (*) [58])"failed: expected \"-inf\"_kj.tryParseAs<double>() == -inf()",
                 (DebugComparison<kj::Maybe<double>,_float> *)&local_98);
    }
  }
  else {
    local_70 = (double)local_58.content.size_ <= -INFINITY;
    local_90.value = (double)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88._0_4_ = -INFINITY;
    local_80 = " == ";
    local_78 = 5;
    if (!local_70) goto joined_r0x00135d2e;
  }
  _local_68 = "-infinity";
  local_60 = 10;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 0) {
    local_70 = false;
joined_r0x00135dfd:
    local_88._0_4_ = -INFINITY;
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88._0_4_ = -INFINITY;
      Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<double>,float>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xb5,ERROR,
                 "\"failed: expected \" \"\\\"-infinity\\\"_kj.tryParseAs<double>() == -inf()\", _kjCondition"
                 ,(char (*) [63])"failed: expected \"-infinity\"_kj.tryParseAs<double>() == -inf()",
                 (DebugComparison<kj::Maybe<double>,_float> *)&local_98);
    }
  }
  else {
    local_70 = (double)local_58.content.size_ <= -INFINITY;
    local_90.value = (double)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88._0_4_ = -INFINITY;
    local_80 = " == ";
    local_78 = 5;
    if (!local_70) goto joined_r0x00135dfd;
  }
  _local_68 = "-INF";
  local_60 = 5;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 0) {
    local_70 = false;
joined_r0x00135ecc:
    local_88._0_4_ = -INFINITY;
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88._0_4_ = -INFINITY;
      Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<double>,float>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xb6,ERROR,
                 "\"failed: expected \" \"\\\"-INF\\\"_kj.tryParseAs<double>() == -inf()\", _kjCondition"
                 ,(char (*) [58])"failed: expected \"-INF\"_kj.tryParseAs<double>() == -inf()",
                 (DebugComparison<kj::Maybe<double>,_float> *)&local_98);
    }
  }
  else {
    local_70 = (double)local_58.content.size_ <= -INFINITY;
    local_90.value = (double)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88._0_4_ = -INFINITY;
    local_80 = " == ";
    local_78 = 5;
    if (!local_70) goto joined_r0x00135ecc;
  }
  _local_68 = "-INFINITY";
  local_60 = 10;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 0) {
    local_70 = false;
joined_r0x00135f9b:
    local_88._0_4_ = -INFINITY;
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88._0_4_ = -INFINITY;
      Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<double>,float>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xb7,ERROR,
                 "\"failed: expected \" \"\\\"-INFINITY\\\"_kj.tryParseAs<double>() == -inf()\", _kjCondition"
                 ,(char (*) [63])"failed: expected \"-INFINITY\"_kj.tryParseAs<double>() == -inf()",
                 (DebugComparison<kj::Maybe<double>,_float> *)&local_98);
    }
  }
  else {
    local_70 = (double)local_58.content.size_ <= -INFINITY;
    local_90.value = (double)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88._0_4_ = -INFINITY;
    local_80 = " == ";
    local_78 = 5;
    if (!local_70) goto joined_r0x00135f9b;
  }
  _local_68 = "-1e100000";
  local_60 = 10;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 0) {
    local_70 = false;
joined_r0x0013606a:
    local_88 = (char *)CONCAT44(local_88._4_4_,0xff800000);
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88 = (char *)CONCAT44(local_88._4_4_,0xff800000);
      Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<double>,float>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xb8,ERROR,
                 "\"failed: expected \" \"\\\"-1e100000\\\"_kj.tryParseAs<double>() == -inf()\", _kjCondition"
                 ,(char (*) [63])"failed: expected \"-1e100000\"_kj.tryParseAs<double>() == -inf()",
                 (DebugComparison<kj::Maybe<double>,_float> *)&local_98);
    }
  }
  else {
    local_70 = (double)local_58.content.size_ <= -INFINITY;
    local_90.value = (double)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88 = (char *)CONCAT44(local_88._4_4_,0xff800000);
    local_80 = " == ";
    local_78 = 5;
    if (!local_70) goto joined_r0x0013606a;
  }
  _local_68 = "nan";
  local_60 = 4;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  local_98 = NAN((double)local_58.content.size_) & (byte)local_58.content.ptr;
  local_97.value = true;
  local_90.value = 9.12914243693976e-318;
  local_88 = &DAT_00000005;
  local_80._0_1_ = (bool)local_98;
  if (((bool)local_98 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[77],kj::_::DebugComparison<bool,bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb9,ERROR,
               "\"failed: expected \" \"isNaN(\\\"nan\\\"_kj.tryParseAs<double>().orDefault(0.0)) == true\", _kjCondition"
               ,(char (*) [77])
                "failed: expected isNaN(\"nan\"_kj.tryParseAs<double>().orDefault(0.0)) == true",
               (DebugComparison<bool,_bool> *)&local_98);
  }
  _local_68 = "NAN";
  local_60 = 4;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  local_98 = NAN((double)local_58.content.size_) & (byte)local_58.content.ptr;
  local_97.value = true;
  local_90.value = 9.12914243693976e-318;
  local_88 = &DAT_00000005;
  local_80._0_1_ = (bool)local_98;
  if (((bool)local_98 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[77],kj::_::DebugComparison<bool,bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xba,ERROR,
               "\"failed: expected \" \"isNaN(\\\"NAN\\\"_kj.tryParseAs<double>().orDefault(0.0)) == true\", _kjCondition"
               ,(char (*) [77])
                "failed: expected isNaN(\"NAN\"_kj.tryParseAs<double>().orDefault(0.0)) == true",
               (DebugComparison<bool,_bool> *)&local_98);
  }
  _local_68 = "NaN";
  local_60 = 4;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  local_98 = NAN((double)local_58.content.size_) & (byte)local_58.content.ptr;
  local_97.value = true;
  local_90.value = 9.12914243693976e-318;
  local_88 = &DAT_00000005;
  local_80 = (char *)CONCAT71(local_80._1_7_,local_98);
  if (((bool)local_98 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[77],kj::_::DebugComparison<bool,bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xbb,ERROR,
               "\"failed: expected \" \"isNaN(\\\"NaN\\\"_kj.tryParseAs<double>().orDefault(0.0)) == true\", _kjCondition"
               ,(char (*) [77])
                "failed: expected isNaN(\"NaN\"_kj.tryParseAs<double>().orDefault(0.0)) == true",
               (DebugComparison<bool,_bool> *)&local_98);
  }
  local_38 = "";
  _local_68 = "";
  local_60 = 1;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 1) {
    local_90.value = (double)local_58.content.size_;
  }
  local_98 = (byte)local_58.content.ptr;
  local_70 = (bool)((byte)local_58.content.ptr ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if (((byte)local_58.content.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<double>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xbc,ERROR,
               "\"failed: expected \" \"\\\"\\\"_kj.tryParseAs<double>() == kj::none\", _kjCondition"
               ,(char (*) [56])"failed: expected \"\"_kj.tryParseAs<double>() == kj::none",
               (DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)&local_98);
  }
  _local_68 = "a";
  local_60 = 2;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 1) {
    local_90.value = (double)local_58.content.size_;
  }
  local_98 = (byte)local_58.content.ptr;
  local_70 = (bool)((byte)local_58.content.ptr ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if (((byte)local_58.content.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<double>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xbd,ERROR,
               "\"failed: expected \" \"\\\"a\\\"_kj.tryParseAs<double>() == kj::none\", _kjCondition"
               ,(char (*) [57])"failed: expected \"a\"_kj.tryParseAs<double>() == kj::none",
               (DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)&local_98);
  }
  _local_68 = "1a";
  local_60 = 3;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 1) {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
  }
  local_98 = (byte)local_58.content.ptr;
  local_70 = (bool)((byte)local_58.content.ptr ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if (((byte)local_58.content.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<double>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xbe,ERROR,
               "\"failed: expected \" \"\\\"1a\\\"_kj.tryParseAs<double>() == kj::none\", _kjCondition"
               ,(char (*) [58])"failed: expected \"1a\"_kj.tryParseAs<double>() == kj::none",
               (DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)&local_98);
  }
  _local_68 = "+-1";
  local_60 = 4;
  StringPtr::tryParseAs<double>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 1) {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
  }
  local_98 = (byte)local_58.content.ptr;
  local_70 = (bool)((byte)local_58.content.ptr ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if (((byte)local_58.content.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[59],kj::_::DebugComparison<kj::Maybe<double>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xbf,ERROR,
               "\"failed: expected \" \"\\\"+-1\\\"_kj.tryParseAs<double>() == kj::none\", _kjCondition"
               ,(char (*) [59])"failed: expected \"+-1\"_kj.tryParseAs<double>() == kj::none",
               (DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)&local_98);
  }
  local_58.content.ptr = "1";
  local_58.content.size_ = 2;
  StringPtr::tryParseAs<float>((StringPtr *)local_68);
  if (local_68[0] == '\0') {
    local_78 = (ulong)local_78._1_7_ << 8;
joined_r0x001364c0:
    local_80 = &DAT_00000005;
    local_88 = anon_var_dwarf_19d17;
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x3ff0000000000000;
    local_98 = local_68[0];
    if (Debug::minSeverity < 3) {
      local_80 = &DAT_00000005;
      local_88 = " == ";
      local_90.value = 1.0;
      Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::Maybe<float>,double>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xc1,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<float>() == 1.0\", _kjCondition",
                 (char (*) [51])"failed: expected \"1\"_kj.tryParseAs<float>() == 1.0",
                 (DebugComparison<kj::Maybe<float>,_double> *)&local_98);
    }
  }
  else {
    local_94.value = aStack_64.value;
    local_98 = local_68[0];
    local_90.value = 1.0;
    local_88 = " == ";
    local_80 = &DAT_00000005;
    local_78 = CONCAT71(local_78._1_7_,aStack_64.value == 1.0);
    if ((aStack_64.value != 1.0) || (NAN(aStack_64.value))) goto joined_r0x001364c0;
  }
  _local_68 = "1";
  local_60 = 2;
  StringPtr::tryParseAs<long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == '\0') {
    local_70 = false;
joined_r0x00136564:
    local_88 = (char *)CONCAT44(local_88._4_4_,1);
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88 = (char *)CONCAT44(local_88._4_4_,1);
      Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::Maybe<long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xc3,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<int64_t>() == 1\", _kjCondition",
                 (char (*) [51])"failed: expected \"1\"_kj.tryParseAs<int64_t>() == 1",
                 (DebugComparison<kj::Maybe<long>,_int> *)&local_98);
    }
  }
  else {
    local_90.value = (double)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88 = (char *)CONCAT44(local_88._4_4_,1);
    local_80 = " == ";
    local_78 = 5;
    local_70 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_ ==
               (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1;
    if (!local_70) goto joined_r0x00136564;
  }
  _local_68 = "9223372036854775807";
  local_60 = 0x14;
  StringPtr::tryParseAs<long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == '\0') {
    local_70 = false;
joined_r0x00136612:
    local_78 = 5;
    local_80 = " == ";
    local_88 = (char *)0x7fffffffffffffff;
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88 = (char *)0x7fffffffffffffff;
      Debug::log<char_const(&)[89],kj::_::DebugComparison<kj::Maybe<long>,long_long>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xc4,ERROR,
                 "\"failed: expected \" \"\\\"9223372036854775807\\\"_kj.tryParseAs<int64_t>() == 9223372036854775807LL\", _kjCondition"
                 ,(char (*) [89])
                  "failed: expected \"9223372036854775807\"_kj.tryParseAs<int64_t>() == 9223372036854775807LL"
                 ,(DebugComparison<kj::Maybe<long>,_long_long> *)&local_98);
    }
  }
  else {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88 = (char *)0x7fffffffffffffff;
    local_80 = " == ";
    local_78 = 5;
    local_70 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_ ==
               (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x7fffffffffffffff;
    if (!local_70) goto joined_r0x00136612;
  }
  _local_68 = "-9223372036854775808";
  local_60 = 0x15;
  StringPtr::tryParseAs<long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == '\0') {
    local_70 = false;
joined_r0x001366bc:
    local_78 = 5;
    local_80 = " == ";
    local_88 = (char *)0x8000000000000000;
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88 = (char *)0x8000000000000000;
      Debug::log<char_const(&)[92],kj::_::DebugComparison<kj::Maybe<long>,unsigned_long_long>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xc5,ERROR,
                 "\"failed: expected \" \"\\\"-9223372036854775808\\\"_kj.tryParseAs<int64_t>() == -9223372036854775808ULL\", _kjCondition"
                 ,(char (*) [92])
                  "failed: expected \"-9223372036854775808\"_kj.tryParseAs<int64_t>() == -9223372036854775808ULL"
                 ,(DebugComparison<kj::Maybe<long>,_unsigned_long_long> *)&local_98);
    }
  }
  else {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88 = (char *)0x8000000000000000;
    local_80 = " == ";
    local_78 = 5;
    local_70 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_ ==
               (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x8000000000000000;
    if (!local_70) goto joined_r0x001366bc;
  }
  _local_68 = "9223372036854775808";
  local_60 = 0x14;
  StringPtr::tryParseAs<long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 1) {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
  }
  local_98 = (byte)local_58.content.ptr;
  local_70 = (bool)((byte)local_58.content.ptr ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if (((byte)local_58.content.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[76],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xc6,ERROR,
               "\"failed: expected \" \"\\\"9223372036854775808\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
               ,(char (*) [76])
                "failed: expected \"9223372036854775808\"_kj.tryParseAs<int64_t>() == kj::none",
               (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)&local_98);
  }
  _local_68 = "-9223372036854775809";
  local_60 = 0x15;
  StringPtr::tryParseAs<long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 1) {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
  }
  local_98 = (byte)local_58.content.ptr;
  local_70 = (bool)((byte)local_58.content.ptr ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if (((byte)local_58.content.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[77],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,199,ERROR,
               "\"failed: expected \" \"\\\"-9223372036854775809\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
               ,(char (*) [77])
                "failed: expected \"-9223372036854775809\"_kj.tryParseAs<int64_t>() == kj::none",
               (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)&local_98);
  }
  _local_68 = "";
  local_60 = 1;
  StringPtr::tryParseAs<long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 1) {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
  }
  local_98 = (byte)local_58.content.ptr;
  local_70 = (bool)((byte)local_58.content.ptr ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if (((byte)local_58.content.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,200,ERROR,
               "\"failed: expected \" \"\\\"\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
               ,(char (*) [57])"failed: expected \"\"_kj.tryParseAs<int64_t>() == kj::none",
               (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)&local_98);
  }
  _local_68 = "a";
  local_60 = 2;
  StringPtr::tryParseAs<long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 1) {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
  }
  local_98 = (byte)local_58.content.ptr;
  local_70 = (bool)((byte)local_58.content.ptr ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if (((byte)local_58.content.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xc9,ERROR,
               "\"failed: expected \" \"\\\"a\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
               ,(char (*) [58])"failed: expected \"a\"_kj.tryParseAs<int64_t>() == kj::none",
               (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)&local_98);
  }
  _local_68 = "1a";
  local_60 = 3;
  StringPtr::tryParseAs<long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 1) {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
  }
  local_98 = (byte)local_58.content.ptr;
  local_70 = (bool)((byte)local_58.content.ptr ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if (((byte)local_58.content.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[59],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xca,ERROR,
               "\"failed: expected \" \"\\\"1a\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
               ,(char (*) [59])"failed: expected \"1a\"_kj.tryParseAs<int64_t>() == kj::none",
               (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)&local_98);
  }
  _local_68 = "+-1";
  local_60 = 4;
  StringPtr::tryParseAs<long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 1) {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
  }
  local_98 = (byte)local_58.content.ptr;
  local_70 = (bool)((byte)local_58.content.ptr ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if (((byte)local_58.content.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[60],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xcb,ERROR,
               "\"failed: expected \" \"\\\"+-1\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
               ,(char (*) [60])"failed: expected \"+-1\"_kj.tryParseAs<int64_t>() == kj::none",
               (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)&local_98);
  }
  _local_68 = "010";
  local_60 = 4;
  StringPtr::tryParseAs<long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == '\0') {
    local_70 = false;
joined_r0x00136a7f:
    local_88._0_4_ = 1.4013e-44;
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88._0_4_ = 1.4013e-44;
      Debug::log<char_const(&)[54],kj::_::DebugComparison<kj::Maybe<long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xcc,ERROR,
                 "\"failed: expected \" \"\\\"010\\\"_kj.tryParseAs<int64_t>() == 10\", _kjCondition"
                 ,(char (*) [54])"failed: expected \"010\"_kj.tryParseAs<int64_t>() == 10",
                 (DebugComparison<kj::Maybe<long>,_int> *)&local_98);
    }
  }
  else {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88._0_4_ = 1.4013e-44;
    local_80 = " == ";
    local_78 = 5;
    local_70 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_ ==
               (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xa;
    if (!local_70) goto joined_r0x00136a7f;
  }
  _local_68 = "0010";
  local_60 = 5;
  StringPtr::tryParseAs<long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == '\0') {
    local_70 = false;
joined_r0x00136b2a:
    local_88._0_4_ = 1.4013e-44;
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88._0_4_ = 1.4013e-44;
      Debug::log<char_const(&)[55],kj::_::DebugComparison<kj::Maybe<long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xcd,ERROR,
                 "\"failed: expected \" \"\\\"0010\\\"_kj.tryParseAs<int64_t>() == 10\", _kjCondition"
                 ,(char (*) [55])"failed: expected \"0010\"_kj.tryParseAs<int64_t>() == 10",
                 (DebugComparison<kj::Maybe<long>,_int> *)&local_98);
    }
  }
  else {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88._0_4_ = 1.4013e-44;
    local_80 = " == ";
    local_78 = 5;
    local_70 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_ ==
               (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xa;
    if (!local_70) goto joined_r0x00136b2a;
  }
  _local_68 = "0x10";
  local_60 = 5;
  StringPtr::tryParseAs<long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == '\0') {
    local_70 = false;
joined_r0x00136bd5:
    local_88._0_4_ = 2.24208e-44;
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88._0_4_ = 2.24208e-44;
      Debug::log<char_const(&)[55],kj::_::DebugComparison<kj::Maybe<long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xce,ERROR,
                 "\"failed: expected \" \"\\\"0x10\\\"_kj.tryParseAs<int64_t>() == 16\", _kjCondition"
                 ,(char (*) [55])"failed: expected \"0x10\"_kj.tryParseAs<int64_t>() == 16",
                 (DebugComparison<kj::Maybe<long>,_int> *)&local_98);
    }
  }
  else {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88._0_4_ = 2.24208e-44;
    local_80 = " == ";
    local_78 = 5;
    local_70 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_ ==
               (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x10;
    if (!local_70) goto joined_r0x00136bd5;
  }
  _local_68 = "0X10";
  local_60 = 5;
  StringPtr::tryParseAs<long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == '\0') {
    local_70 = false;
joined_r0x00136c80:
    local_88._0_4_ = 2.24208e-44;
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88._0_4_ = 2.24208e-44;
      Debug::log<char_const(&)[55],kj::_::DebugComparison<kj::Maybe<long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xcf,ERROR,
                 "\"failed: expected \" \"\\\"0X10\\\"_kj.tryParseAs<int64_t>() == 16\", _kjCondition"
                 ,(char (*) [55])"failed: expected \"0X10\"_kj.tryParseAs<int64_t>() == 16",
                 (DebugComparison<kj::Maybe<long>,_int> *)&local_98);
    }
  }
  else {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88._0_4_ = 2.24208e-44;
    local_80 = " == ";
    local_78 = 5;
    local_70 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_ ==
               (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x10;
    if (!local_70) goto joined_r0x00136c80;
  }
  _local_68 = "-010";
  local_60 = 5;
  StringPtr::tryParseAs<long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == '\0') {
    local_70 = false;
joined_r0x00136d2b:
    local_88._0_4_ = -NAN;
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88._0_4_ = -NAN;
      Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xd0,ERROR,
                 "\"failed: expected \" \"\\\"-010\\\"_kj.tryParseAs<int64_t>() == -10\", _kjCondition"
                 ,(char (*) [56])"failed: expected \"-010\"_kj.tryParseAs<int64_t>() == -10",
                 (DebugComparison<kj::Maybe<long>,_int> *)&local_98);
    }
  }
  else {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88._0_4_ = -NAN;
    local_80 = " == ";
    local_78 = 5;
    local_70 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_ ==
               (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xfffffffffffffff6;
    if (!local_70) goto joined_r0x00136d2b;
  }
  _local_68 = "-0x10";
  local_60 = 6;
  StringPtr::tryParseAs<long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == '\0') {
    local_70 = false;
joined_r0x00136dd6:
    local_88._0_4_ = -NAN;
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88._0_4_ = -NAN;
      Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xd1,ERROR,
                 "\"failed: expected \" \"\\\"-0x10\\\"_kj.tryParseAs<int64_t>() == -16\", _kjCondition"
                 ,(char (*) [57])"failed: expected \"-0x10\"_kj.tryParseAs<int64_t>() == -16",
                 (DebugComparison<kj::Maybe<long>,_int> *)&local_98);
    }
  }
  else {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88._0_4_ = -NAN;
    local_80 = " == ";
    local_78 = 5;
    local_70 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_ ==
               (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xfffffffffffffff0;
    if (!local_70) goto joined_r0x00136dd6;
  }
  _local_68 = "-0X10";
  local_60 = 6;
  StringPtr::tryParseAs<long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == '\0') {
    local_70 = false;
joined_r0x00136e81:
    local_88._0_4_ = -NAN;
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88._0_4_ = -NAN;
      Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xd2,ERROR,
                 "\"failed: expected \" \"\\\"-0X10\\\"_kj.tryParseAs<int64_t>() == -16\", _kjCondition"
                 ,(char (*) [57])"failed: expected \"-0X10\"_kj.tryParseAs<int64_t>() == -16",
                 (DebugComparison<kj::Maybe<long>,_int> *)&local_98);
    }
  }
  else {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88._0_4_ = -NAN;
    local_80 = " == ";
    local_78 = 5;
    local_70 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_ ==
               (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xfffffffffffffff0;
    if (!local_70) goto joined_r0x00136e81;
  }
  _local_68 = "1";
  local_60 = 2;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == '\0') {
    local_70 = false;
joined_r0x00136f25:
    local_88._0_4_ = 1.4013e-45;
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88._0_4_ = 1.4013e-45;
      Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<unsigned_long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xd4,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<uint64_t>() == 1\", _kjCondition",
                 (char (*) [52])"failed: expected \"1\"_kj.tryParseAs<uint64_t>() == 1",
                 (DebugComparison<kj::Maybe<unsigned_long>,_int> *)&local_98);
    }
  }
  else {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88._0_4_ = 1.4013e-45;
    local_80 = " == ";
    local_78 = 5;
    local_70 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_ ==
               (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1;
    if (!local_70) goto joined_r0x00136f25;
  }
  _local_68 = "0";
  local_60 = 2;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == '\0') {
    local_88 = (char *)((ulong)local_88._4_4_ << 0x20);
    local_70 = false;
joined_r0x00136fcf:
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<unsigned_long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xd5,ERROR,
                 "\"failed: expected \" \"\\\"0\\\"_kj.tryParseAs<uint64_t>() == 0\", _kjCondition",
                 (char (*) [52])"failed: expected \"0\"_kj.tryParseAs<uint64_t>() == 0",
                 (DebugComparison<kj::Maybe<unsigned_long>,_int> *)&local_98);
    }
  }
  else {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88 = (char *)((ulong)local_88._4_4_ << 0x20);
    local_80 = " == ";
    local_78 = 5;
    local_70 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_ ==
               (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x0;
    if (!local_70) goto joined_r0x00136fcf;
  }
  _local_68 = "18446744073709551615";
  local_60 = 0x15;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == '\0') {
    local_70 = false;
joined_r0x0013707c:
    local_78 = 5;
    local_80 = " == ";
    local_88 = (char *)0xffffffffffffffff;
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88 = (char *)0xffffffffffffffff;
      Debug::
      log<char_const(&)[93],kj::_::DebugComparison<kj::Maybe<unsigned_long>,unsigned_long_long>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xd6,ERROR,
                 "\"failed: expected \" \"\\\"18446744073709551615\\\"_kj.tryParseAs<uint64_t>() == 18446744073709551615ULL\", _kjCondition"
                 ,(char (*) [93])
                  "failed: expected \"18446744073709551615\"_kj.tryParseAs<uint64_t>() == 18446744073709551615ULL"
                 ,(DebugComparison<kj::Maybe<unsigned_long>,_unsigned_long_long> *)&local_98);
    }
  }
  else {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88 = (char *)0xffffffffffffffff;
    local_80 = " == ";
    local_78 = 5;
    local_70 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_ ==
               (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xffffffffffffffff;
    if (!local_70) goto joined_r0x0013707c;
  }
  _local_68 = "-1";
  local_60 = 3;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 1) {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
  }
  local_98 = (byte)local_58.content.ptr;
  local_70 = (bool)((byte)local_58.content.ptr ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if (((byte)local_58.content.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[60],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd7,ERROR,
               "\"failed: expected \" \"\\\"-1\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
               ,(char (*) [60])"failed: expected \"-1\"_kj.tryParseAs<uint64_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)&local_98);
  }
  _local_68 = "18446744073709551616";
  local_60 = 0x15;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 1) {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
  }
  local_98 = (byte)local_58.content.ptr;
  local_70 = (bool)((byte)local_58.content.ptr ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if (((byte)local_58.content.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[78],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd8,ERROR,
               "\"failed: expected \" \"\\\"18446744073709551616\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
               ,(char (*) [78])
                "failed: expected \"18446744073709551616\"_kj.tryParseAs<uint64_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)&local_98);
  }
  _local_68 = "";
  local_60 = 1;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 1) {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
  }
  local_98 = (byte)local_58.content.ptr;
  local_70 = (bool)((byte)local_58.content.ptr ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if (((byte)local_58.content.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd9,ERROR,
               "\"failed: expected \" \"\\\"\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
               ,(char (*) [58])"failed: expected \"\"_kj.tryParseAs<uint64_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)&local_98);
  }
  _local_68 = "a";
  local_60 = 2;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 1) {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
  }
  local_98 = (byte)local_58.content.ptr;
  local_70 = (bool)((byte)local_58.content.ptr ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if (((byte)local_58.content.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[59],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xda,ERROR,
               "\"failed: expected \" \"\\\"a\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
               ,(char (*) [59])"failed: expected \"a\"_kj.tryParseAs<uint64_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)&local_98);
  }
  _local_68 = "1a";
  local_60 = 3;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 1) {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
  }
  local_98 = (byte)local_58.content.ptr;
  local_70 = (bool)((byte)local_58.content.ptr ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if (((byte)local_58.content.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[60],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xdb,ERROR,
               "\"failed: expected \" \"\\\"1a\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
               ,(char (*) [60])"failed: expected \"1a\"_kj.tryParseAs<uint64_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)&local_98);
  }
  _local_68 = "+-1";
  local_60 = 4;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == 1) {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
  }
  local_98 = (byte)local_58.content.ptr;
  local_70 = (bool)((byte)local_58.content.ptr ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if (((byte)local_58.content.ptr != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xdc,ERROR,
               "\"failed: expected \" \"\\\"+-1\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
               ,(char (*) [61])"failed: expected \"+-1\"_kj.tryParseAs<uint64_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)&local_98);
  }
  local_58.content.ptr = "1";
  local_58.content.size_ = 2;
  StringPtr::tryParseAs<int>((StringPtr *)local_68);
  if (local_68[0] == '\0') {
    local_78._0_1_ = false;
joined_r0x00137435:
    local_90._0_4_ = 1;
    local_80 = &DAT_00000005;
    local_88 = anon_var_dwarf_19d17;
    local_98 = local_68[0];
    if (Debug::minSeverity < 3) {
      local_80 = &DAT_00000005;
      local_88 = " == ";
      local_90._0_4_ = 1;
      Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::Maybe<int>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xde,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<int32_t>() == 1\", _kjCondition",
                 (char (*) [51])"failed: expected \"1\"_kj.tryParseAs<int32_t>() == 1",
                 (DebugComparison<kj::Maybe<int>,_int> *)&local_98);
    }
  }
  else {
    local_94 = aStack_64;
    local_98 = local_68[0];
    local_90._0_4_ = 1;
    local_88 = " == ";
    local_80 = &DAT_00000005;
    local_78._0_1_ = aStack_64 == (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1;
    if (!(bool)(byte)local_78) goto joined_r0x00137435;
  }
  local_58.content.ptr = "2147483647";
  local_58.content.size_ = 0xb;
  StringPtr::tryParseAs<int>((StringPtr *)local_68);
  if (local_68[0] == '\0') {
    local_78._0_1_ = false;
joined_r0x001374dd:
    local_90._0_4_ = 0x7fffffff;
    local_80 = &DAT_00000005;
    local_88 = anon_var_dwarf_19d17;
    local_98 = local_68[0];
    if (Debug::minSeverity < 3) {
      local_80 = &DAT_00000005;
      local_88 = " == ";
      local_90._0_4_ = 0x7fffffff;
      Debug::log<char_const(&)[69],kj::_::DebugComparison<kj::Maybe<int>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xdf,ERROR,
                 "\"failed: expected \" \"\\\"2147483647\\\"_kj.tryParseAs<int32_t>() == 2147483647\", _kjCondition"
                 ,(char (*) [69])
                  "failed: expected \"2147483647\"_kj.tryParseAs<int32_t>() == 2147483647",
                 (DebugComparison<kj::Maybe<int>,_int> *)&local_98);
    }
  }
  else {
    local_94 = aStack_64;
    local_98 = local_68[0];
    local_90._0_4_ = 0x7fffffff;
    local_88 = " == ";
    local_80 = &DAT_00000005;
    local_78._0_1_ = aStack_64 == (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x7fffffff;
    if (!(bool)(byte)local_78) goto joined_r0x001374dd;
  }
  local_58.content.ptr = "-2147483648";
  local_58.content.size_ = 0xc;
  StringPtr::tryParseAs<int>((StringPtr *)local_68);
  if (local_68[0] != '\0') {
    local_94 = aStack_64;
  }
  local_78 = (ulong)local_78._1_7_ << 8;
  local_80 = &DAT_00000005;
  local_88 = anon_var_dwarf_19d17;
  local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xffffffff80000000;
  local_98 = local_68[0];
  if (Debug::minSeverity < 3) {
    local_80 = &DAT_00000005;
    local_88 = " == ";
    local_90.value = -NAN;
    Debug::log<char_const(&)[71],kj::_::DebugComparison<kj::Maybe<int>,long>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe0,ERROR,
               "\"failed: expected \" \"\\\"-2147483648\\\"_kj.tryParseAs<int32_t>() == -2147483648\", _kjCondition"
               ,(char (*) [71])
                "failed: expected \"-2147483648\"_kj.tryParseAs<int32_t>() == -2147483648",
               (DebugComparison<kj::Maybe<int>,_long> *)&local_98);
  }
  local_58.content.ptr = "2147483648";
  local_58.content.size_ = 0xb;
  StringPtr::tryParseAs<int>((StringPtr *)local_68);
  if (local_68[0] == '\x01') {
    local_94 = aStack_64;
  }
  local_98 = local_68[0];
  local_90.value = (double)&none;
  local_88 = " == ";
  local_80 = &DAT_00000005;
  local_78 = CONCAT71(local_78._1_7_,local_68[0]) ^ 1;
  if ((local_68[0] != '\0') && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[67],kj::_::DebugComparison<kj::Maybe<int>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe1,ERROR,
               "\"failed: expected \" \"\\\"2147483648\\\"_kj.tryParseAs<int32_t>() == kj::none\", _kjCondition"
               ,(char (*) [67])
                "failed: expected \"2147483648\"_kj.tryParseAs<int32_t>() == kj::none",
               (DebugComparison<kj::Maybe<int>,_const_kj::None_&> *)&local_98);
  }
  local_58.content.ptr = "-2147483649";
  local_58.content.size_ = 0xc;
  StringPtr::tryParseAs<int>((StringPtr *)local_68);
  if (local_68[0] == '\x01') {
    local_94 = aStack_64;
  }
  local_98 = local_68[0];
  local_90.value = (double)&none;
  local_88 = " == ";
  local_80 = &DAT_00000005;
  local_78 = CONCAT71(local_78._1_7_,local_68[0]) ^ 1;
  if ((local_68[0] != '\0') && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[68],kj::_::DebugComparison<kj::Maybe<int>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe2,ERROR,
               "\"failed: expected \" \"\\\"-2147483649\\\"_kj.tryParseAs<int32_t>() == kj::none\", _kjCondition"
               ,(char (*) [68])
                "failed: expected \"-2147483649\"_kj.tryParseAs<int32_t>() == kj::none",
               (DebugComparison<kj::Maybe<int>,_const_kj::None_&> *)&local_98);
  }
  local_58.content.ptr = "1";
  local_58.content.size_ = 2;
  StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_68);
  if (local_68[0] == '\0') {
    local_78._0_1_ = false;
joined_r0x0013772b:
    local_90._0_4_ = 1;
    local_80 = &DAT_00000005;
    local_88 = anon_var_dwarf_19d17;
    local_98 = local_68[0];
    if (Debug::minSeverity < 3) {
      local_80 = &DAT_00000005;
      local_88 = " == ";
      local_90._0_4_ = 1;
      Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<unsigned_int>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xe4,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<uint32_t>() == 1\", _kjCondition",
                 (char (*) [52])"failed: expected \"1\"_kj.tryParseAs<uint32_t>() == 1",
                 (DebugComparison<kj::Maybe<unsigned_int>,_int> *)&local_98);
    }
  }
  else {
    local_94 = aStack_64;
    local_98 = local_68[0];
    local_90._0_4_ = 1;
    local_88 = " == ";
    local_80 = &DAT_00000005;
    local_78._0_1_ = aStack_64 == (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1;
    if (!(bool)(byte)local_78) goto joined_r0x0013772b;
  }
  local_58.content.ptr = "0";
  local_58.content.size_ = 2;
  StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_68);
  if (local_68[0] == '\0') {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)
               ((ulong)(uint)local_90._4_4_ << 0x20);
    local_78._0_1_ = false;
joined_r0x001377d2:
    local_80 = &DAT_00000005;
    local_88 = anon_var_dwarf_19d17;
    local_98 = local_68[0];
    if (Debug::minSeverity < 3) {
      local_80 = &DAT_00000005;
      local_88 = " == ";
      Debug::log<char_const(&)[53],kj::_::DebugComparison<kj::Maybe<unsigned_int>,unsigned_int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xe5,ERROR,
                 "\"failed: expected \" \"\\\"0\\\"_kj.tryParseAs<uint32_t>() == 0U\", _kjCondition"
                 ,(char (*) [53])"failed: expected \"0\"_kj.tryParseAs<uint32_t>() == 0U",
                 (DebugComparison<kj::Maybe<unsigned_int>,_unsigned_int> *)&local_98);
    }
  }
  else {
    local_94 = aStack_64;
    local_98 = local_68[0];
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)
               ((ulong)(uint)local_90._4_4_ << 0x20);
    local_88 = " == ";
    local_80 = &DAT_00000005;
    local_78._0_1_ = aStack_64 == (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x0;
    if (!(bool)(byte)local_78) goto joined_r0x001377d2;
  }
  local_58.content.ptr = "4294967295";
  local_58.content.size_ = 0xb;
  StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_68);
  if (local_68[0] == '\0') {
    local_78._0_1_ = false;
joined_r0x0013787a:
    local_90._0_4_ = 0xffffffff;
    local_80 = &DAT_00000005;
    local_88 = anon_var_dwarf_19d17;
    local_98 = local_68[0];
    if (Debug::minSeverity < 3) {
      local_80 = &DAT_00000005;
      local_88 = " == ";
      local_90._0_4_ = 0xffffffff;
      Debug::log<char_const(&)[71],kj::_::DebugComparison<kj::Maybe<unsigned_int>,unsigned_int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xe6,ERROR,
                 "\"failed: expected \" \"\\\"4294967295\\\"_kj.tryParseAs<uint32_t>() == 4294967295U\", _kjCondition"
                 ,(char (*) [71])
                  "failed: expected \"4294967295\"_kj.tryParseAs<uint32_t>() == 4294967295U",
                 (DebugComparison<kj::Maybe<unsigned_int>,_unsigned_int> *)&local_98);
    }
  }
  else {
    local_94 = aStack_64;
    local_98 = local_68[0];
    local_90._0_4_ = 0xffffffff;
    local_88 = " == ";
    local_80 = &DAT_00000005;
    local_78._0_1_ = aStack_64 == (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0xffffffff;
    if (!(bool)(byte)local_78) goto joined_r0x0013787a;
  }
  local_58.content.ptr = "-1";
  local_58.content.size_ = 3;
  StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_68);
  if (local_68[0] == 1) {
    local_94 = aStack_64;
  }
  local_98 = local_68[0];
  local_78._0_1_ = local_68[0] ^ 1;
  local_90.value = (double)&none;
  local_88 = " == ";
  local_80 = &DAT_00000005;
  if ((local_68[0] != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[60],kj::_::DebugComparison<kj::Maybe<unsigned_int>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe7,ERROR,
               "\"failed: expected \" \"\\\"-1\\\"_kj.tryParseAs<uint32_t>() == kj::none\", _kjCondition"
               ,(char (*) [60])"failed: expected \"-1\"_kj.tryParseAs<uint32_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_int>,_const_kj::None_&> *)&local_98);
  }
  local_58.content.ptr = "4294967296";
  local_58.content.size_ = 0xb;
  StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_68);
  if (local_68[0] == '\x01') {
    local_94 = aStack_64;
  }
  local_98 = local_68[0];
  local_90.value = (double)&none;
  local_88 = " == ";
  local_80 = &DAT_00000005;
  local_78 = CONCAT71(local_78._1_7_,local_68[0]) ^ 1;
  if ((local_68[0] != '\0') && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[68],kj::_::DebugComparison<kj::Maybe<unsigned_int>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe8,ERROR,
               "\"failed: expected \" \"\\\"4294967296\\\"_kj.tryParseAs<uint32_t>() == kj::none\", _kjCondition"
               ,(char (*) [68])
                "failed: expected \"4294967296\"_kj.tryParseAs<uint32_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_int>,_const_kj::None_&> *)&local_98);
  }
  local_58.content.ptr = "1";
  local_58.content.size_ = 2;
  StringPtr::tryParseAs<short>((StringPtr *)local_68);
  if (local_68[0] == '\0') {
    local_80._0_1_ = false;
joined_r0x00137a1b:
    local_88 = &DAT_00000005;
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)anon_var_dwarf_19d17;
    local_94 = (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1;
    local_98 = local_68[0];
    if (Debug::minSeverity < 3) {
      local_88 = &DAT_00000005;
      local_90.value = 9.12914243693976e-318;
      local_94.value = 1.4013e-45;
      Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::Maybe<short>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xea,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<int16_t>() == 1\", _kjCondition",
                 (char (*) [51])"failed: expected \"1\"_kj.tryParseAs<int16_t>() == 1",
                 (DebugComparison<kj::Maybe<short>,_int> *)&local_98);
    }
  }
  else {
    local_96.value = aStack_66.value;
    local_98 = local_68[0];
    local_94.value = 1.4013e-45;
    local_90.value = 9.12914243693976e-318;
    local_88 = &DAT_00000005;
    local_80._0_1_ = aStack_66.value == 1;
    if (!local_80._0_1_) goto joined_r0x00137a1b;
  }
  local_58.content.ptr = "1";
  local_58.content.size_ = 2;
  StringPtr::tryParseAs<unsigned_short>((StringPtr *)local_68);
  if (local_68[0] == '\0') {
    local_80._0_1_ = false;
joined_r0x00137abf:
    local_88 = &DAT_00000005;
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)anon_var_dwarf_19d17;
    local_94 = (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1;
    local_98 = local_68[0];
    if (Debug::minSeverity < 3) {
      local_88 = &DAT_00000005;
      local_90.value = 9.12914243693976e-318;
      local_94.value = 1.4013e-45;
      Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<unsigned_short>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xeb,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<uint16_t>() == 1\", _kjCondition",
                 (char (*) [52])"failed: expected \"1\"_kj.tryParseAs<uint16_t>() == 1",
                 (DebugComparison<kj::Maybe<unsigned_short>,_int> *)&local_98);
    }
  }
  else {
    local_96.value = aStack_66.value;
    local_98 = local_68[0];
    local_94.value = 1.4013e-45;
    local_90.value = 9.12914243693976e-318;
    local_88 = &DAT_00000005;
    local_80._0_1_ = aStack_66.value == 1;
    if (!local_80._0_1_) goto joined_r0x00137abf;
  }
  local_58.content.ptr = "1";
  local_58.content.size_ = 2;
  StringPtr::tryParseAs<signed_char>((StringPtr *)local_68);
  if (local_68[0] == '\0') {
    local_80._0_1_ = false;
joined_r0x00137b60:
    local_88 = &DAT_00000005;
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)anon_var_dwarf_19d17;
    local_94 = (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1;
    local_98 = local_68[0];
    if (Debug::minSeverity < 3) {
      local_88 = &DAT_00000005;
      local_90.value = 9.12914243693976e-318;
      local_94.value = 1.4013e-45;
      Debug::log<char_const(&)[50],kj::_::DebugComparison<kj::Maybe<signed_char>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xec,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<int8_t>() == 1\", _kjCondition",
                 (char (*) [50])"failed: expected \"1\"_kj.tryParseAs<int8_t>() == 1",
                 (DebugComparison<kj::Maybe<signed_char>,_int> *)&local_98);
    }
  }
  else {
    local_97.value = local_68[1];
    local_98 = local_68[0];
    local_94.value = 1.4013e-45;
    local_90.value = 9.12914243693976e-318;
    local_88 = &DAT_00000005;
    local_80._0_1_ = local_68[1] == '\x01';
    if (!local_80._0_1_) goto joined_r0x00137b60;
  }
  local_58.content.ptr = "1";
  local_58.content.size_ = 2;
  StringPtr::tryParseAs<unsigned_char>((StringPtr *)local_68);
  if (local_68[0] == '\0') {
    local_80._0_1_ = false;
joined_r0x00137c01:
    local_88 = &DAT_00000005;
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)anon_var_dwarf_19d17;
    local_94 = (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1;
    local_98 = local_68[0];
    if (Debug::minSeverity < 3) {
      local_88 = &DAT_00000005;
      local_90.value = 9.12914243693976e-318;
      local_94.value = 1.4013e-45;
      Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::Maybe<unsigned_char>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xed,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<uint8_t>() == 1\", _kjCondition",
                 (char (*) [51])"failed: expected \"1\"_kj.tryParseAs<uint8_t>() == 1",
                 (DebugComparison<kj::Maybe<unsigned_char>,_int> *)&local_98);
    }
  }
  else {
    local_97.value = local_68[1];
    local_98 = local_68[0];
    local_94.value = 1.4013e-45;
    local_90.value = 9.12914243693976e-318;
    local_88 = &DAT_00000005;
    local_80._0_1_ = local_68[1] == '\x01';
    if (!local_80._0_1_) goto joined_r0x00137c01;
  }
  local_58.content.ptr = "1";
  local_58.content.size_ = 2;
  StringPtr::tryParseAs<char>((StringPtr *)local_68);
  if (local_68[0] == '\0') {
    local_80._0_1_ = false;
joined_r0x00137ca2:
    local_88 = &DAT_00000005;
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)anon_var_dwarf_19d17;
    local_94 = (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1;
    local_98 = local_68[0];
    if (Debug::minSeverity < 3) {
      local_88 = &DAT_00000005;
      local_90.value = 9.12914243693976e-318;
      local_94.value = 1.4013e-45;
      Debug::log<char_const(&)[48],kj::_::DebugComparison<kj::Maybe<char>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xee,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<char>() == 1\", _kjCondition",
                 (char (*) [48])"failed: expected \"1\"_kj.tryParseAs<char>() == 1",
                 (DebugComparison<kj::Maybe<char>,_int> *)&local_98);
    }
  }
  else {
    local_97.value = local_68[1];
    local_98 = local_68[0];
    local_94.value = 1.4013e-45;
    local_90.value = 9.12914243693976e-318;
    local_88 = &DAT_00000005;
    local_80._0_1_ = local_68[1] == '\x01';
    if (!local_80._0_1_) goto joined_r0x00137ca2;
  }
  local_58.content.ptr = "1";
  local_58.content.size_ = 2;
  StringPtr::tryParseAs<signed_char>((StringPtr *)local_68);
  if (local_68[0] == '\0') {
    local_80._0_1_ = false;
joined_r0x00137d43:
    local_88 = &DAT_00000005;
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)anon_var_dwarf_19d17;
    local_94 = (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1;
    local_98 = local_68[0];
    if (Debug::minSeverity < 3) {
      local_88 = &DAT_00000005;
      local_90.value = 9.12914243693976e-318;
      local_94.value = 1.4013e-45;
      Debug::log<char_const(&)[55],kj::_::DebugComparison<kj::Maybe<signed_char>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xef,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<signed char>() == 1\", _kjCondition"
                 ,(char (*) [55])"failed: expected \"1\"_kj.tryParseAs<signed char>() == 1",
                 (DebugComparison<kj::Maybe<signed_char>,_int> *)&local_98);
    }
  }
  else {
    local_97.value = local_68[1];
    local_98 = local_68[0];
    local_94.value = 1.4013e-45;
    local_90.value = 9.12914243693976e-318;
    local_88 = &DAT_00000005;
    local_80._0_1_ = local_68[1] == '\x01';
    if (!local_80._0_1_) goto joined_r0x00137d43;
  }
  local_58.content.ptr = "1";
  local_58.content.size_ = 2;
  StringPtr::tryParseAs<unsigned_char>((StringPtr *)local_68);
  if (local_68[0] == '\0') {
    local_80._0_1_ = false;
joined_r0x00137de4:
    local_88 = &DAT_00000005;
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)anon_var_dwarf_19d17;
    local_94 = (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1;
    local_98 = local_68[0];
    if (Debug::minSeverity < 3) {
      local_88 = &DAT_00000005;
      local_90.value = 9.12914243693976e-318;
      local_94.value = 1.4013e-45;
      Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<unsigned_char>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xf0,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<unsigned char>() == 1\", _kjCondition"
                 ,(char (*) [57])"failed: expected \"1\"_kj.tryParseAs<unsigned char>() == 1",
                 (DebugComparison<kj::Maybe<unsigned_char>,_int> *)&local_98);
    }
  }
  else {
    local_97.value = local_68[1];
    local_98 = local_68[0];
    local_94.value = 1.4013e-45;
    local_90.value = 9.12914243693976e-318;
    local_88 = &DAT_00000005;
    local_80._0_1_ = local_68[1] == '\x01';
    if (!local_80._0_1_) goto joined_r0x00137de4;
  }
  local_58.content.ptr = "1";
  local_58.content.size_ = 2;
  StringPtr::tryParseAs<short>((StringPtr *)local_68);
  if (local_68[0] == '\0') {
    local_80._0_1_ = false;
joined_r0x00137e88:
    local_88 = &DAT_00000005;
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)anon_var_dwarf_19d17;
    local_94 = (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1;
    local_98 = local_68[0];
    if (Debug::minSeverity < 3) {
      local_88 = &DAT_00000005;
      local_90.value = 9.12914243693976e-318;
      local_94.value = 1.4013e-45;
      Debug::log<char_const(&)[49],kj::_::DebugComparison<kj::Maybe<short>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xf1,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<short>() == 1\", _kjCondition",
                 (char (*) [49])"failed: expected \"1\"_kj.tryParseAs<short>() == 1",
                 (DebugComparison<kj::Maybe<short>,_int> *)&local_98);
    }
  }
  else {
    local_96.value = aStack_66.value;
    local_98 = local_68[0];
    local_94.value = 1.4013e-45;
    local_90.value = 9.12914243693976e-318;
    local_88 = &DAT_00000005;
    local_80._0_1_ = aStack_66.value == 1;
    if (!local_80._0_1_) goto joined_r0x00137e88;
  }
  local_58.content.ptr = "1";
  local_58.content.size_ = 2;
  StringPtr::tryParseAs<unsigned_short>((StringPtr *)local_68);
  if (local_68[0] == '\0') {
    local_80 = (char *)((ulong)local_80._1_7_ << 8);
joined_r0x00137f2c:
    local_88 = &DAT_00000005;
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)anon_var_dwarf_19d17;
    local_94 = (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1;
    local_98 = local_68[0];
    if (Debug::minSeverity < 3) {
      local_88 = &DAT_00000005;
      local_90.value = 9.12914243693976e-318;
      local_94.value = 1.4013e-45;
      Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<unsigned_short>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xf2,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<unsigned short>() == 1\", _kjCondition"
                 ,(char (*) [58])"failed: expected \"1\"_kj.tryParseAs<unsigned short>() == 1",
                 (DebugComparison<kj::Maybe<unsigned_short>,_int> *)&local_98);
    }
  }
  else {
    local_96.value = aStack_66.value;
    local_98 = local_68[0];
    local_94.value = 1.4013e-45;
    local_90.value = 9.12914243693976e-318;
    local_88 = &DAT_00000005;
    local_80 = (char *)CONCAT71(local_80._1_7_,aStack_66.value == 1);
    if (aStack_66.value != 1) goto joined_r0x00137f2c;
  }
  local_58.content.ptr = "1";
  local_58.content.size_ = 2;
  StringPtr::tryParseAs<int>((StringPtr *)local_68);
  if (local_68[0] == '\0') {
    local_78._0_1_ = false;
joined_r0x00137fcd:
    local_90._0_4_ = 1;
    local_80 = &DAT_00000005;
    local_88 = anon_var_dwarf_19d17;
    local_98 = local_68[0];
    if (Debug::minSeverity < 3) {
      local_80 = &DAT_00000005;
      local_88 = " == ";
      local_90._0_4_ = 1;
      Debug::log<char_const(&)[47],kj::_::DebugComparison<kj::Maybe<int>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xf3,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<int>() == 1\", _kjCondition",
                 (char (*) [47])"failed: expected \"1\"_kj.tryParseAs<int>() == 1",
                 (DebugComparison<kj::Maybe<int>,_int> *)&local_98);
    }
  }
  else {
    local_94 = aStack_64;
    local_98 = local_68[0];
    local_90._0_4_ = 1;
    local_88 = " == ";
    local_80 = &DAT_00000005;
    local_78._0_1_ = aStack_64 == (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1;
    if (!(bool)(byte)local_78) goto joined_r0x00137fcd;
  }
  local_58.content.ptr = "1";
  local_58.content.size_ = 2;
  StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_68);
  if (local_68[0] == '\0') {
    local_78 = (ulong)local_78._1_7_ << 8;
joined_r0x0013806e:
    local_90._0_4_ = 1;
    local_80 = &DAT_00000005;
    local_88 = anon_var_dwarf_19d17;
    local_98 = local_68[0];
    if (Debug::minSeverity < 3) {
      local_80 = &DAT_00000005;
      local_88 = " == ";
      local_90._0_4_ = 1;
      Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<unsigned_int>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xf4,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<unsigned>() == 1\", _kjCondition",
                 (char (*) [52])"failed: expected \"1\"_kj.tryParseAs<unsigned>() == 1",
                 (DebugComparison<kj::Maybe<unsigned_int>,_int> *)&local_98);
    }
  }
  else {
    local_94 = aStack_64;
    local_98 = local_68[0];
    local_90._0_4_ = 1;
    local_88 = " == ";
    local_80 = &DAT_00000005;
    local_78 = CONCAT71(local_78._1_7_,
                        aStack_64 == (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1);
    if (aStack_64 != (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1)
    goto joined_r0x0013806e;
  }
  _local_68 = "1";
  local_60 = 2;
  StringPtr::tryParseAs<long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == '\0') {
    local_70 = false;
joined_r0x00138112:
    local_88._0_4_ = 1.4013e-45;
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88._0_4_ = 1.4013e-45;
      Debug::log<char_const(&)[48],kj::_::DebugComparison<kj::Maybe<long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xf5,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<long>() == 1\", _kjCondition",
                 (char (*) [48])"failed: expected \"1\"_kj.tryParseAs<long>() == 1",
                 (DebugComparison<kj::Maybe<long>,_int> *)&local_98);
    }
  }
  else {
    local_90.value = (double)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88._0_4_ = 1.4013e-45;
    local_80 = " == ";
    local_78 = 5;
    local_70 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_ ==
               (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1;
    if (!local_70) goto joined_r0x00138112;
  }
  _local_68 = "1";
  local_60 = 2;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == '\0') {
    local_70 = false;
joined_r0x001381b6:
    local_88._0_4_ = 1.4013e-45;
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88._0_4_ = 1.4013e-45;
      Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<unsigned_long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xf6,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<unsigned long>() == 1\", _kjCondition"
                 ,(char (*) [57])"failed: expected \"1\"_kj.tryParseAs<unsigned long>() == 1",
                 (DebugComparison<kj::Maybe<unsigned_long>,_int> *)&local_98);
    }
  }
  else {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88._0_4_ = 1.4013e-45;
    local_80 = " == ";
    local_78 = 5;
    local_70 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_ ==
               (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1;
    if (!local_70) goto joined_r0x001381b6;
  }
  _local_68 = "1";
  local_60 = 2;
  StringPtr::tryParseAs<long_long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == '\0') {
    local_70 = false;
joined_r0x0013825a:
    local_88._0_4_ = 1.4013e-45;
    local_78 = 5;
    local_80 = " == ";
    local_98 = (byte)local_58.content.ptr;
    if (Debug::minSeverity < 3) {
      local_78 = 5;
      local_80 = " == ";
      local_88._0_4_ = 1.4013e-45;
      Debug::log<char_const(&)[53],kj::_::DebugComparison<kj::Maybe<long_long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xf7,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<long long>() == 1\", _kjCondition"
                 ,(char (*) [53])"failed: expected \"1\"_kj.tryParseAs<long long>() == 1",
                 (DebugComparison<kj::Maybe<long_long>,_int> *)&local_98);
    }
  }
  else {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88._0_4_ = 1.4013e-45;
    local_80 = " == ";
    local_78 = 5;
    local_70 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_ ==
               (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1;
    if (!local_70) goto joined_r0x0013825a;
  }
  _local_68 = "1";
  local_60 = 2;
  StringPtr::tryParseAs<unsigned_long_long>((StringPtr *)&local_58);
  if ((byte)local_58.content.ptr == '\0') {
    local_70 = false;
  }
  else {
    local_90.value = (double)local_58.content.size_;
    local_98 = (byte)local_58.content.ptr;
    local_88 = (char *)CONCAT44(local_88._4_4_,1);
    local_80 = " == ";
    local_78 = 5;
    local_70 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_ ==
               (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1;
    if (local_70) goto LAB_00138327;
  }
  local_88 = (char *)CONCAT44(local_88._4_4_,1);
  local_78 = 5;
  local_80 = " == ";
  local_98 = (byte)local_58.content.ptr;
  if (Debug::minSeverity < 3) {
    local_78 = 5;
    local_80 = " == ";
    local_88 = (char *)CONCAT44(local_88._4_4_,1);
    Debug::log<char_const(&)[62],kj::_::DebugComparison<kj::Maybe<unsigned_long_long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xf8,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<unsigned long long>() == 1\", _kjCondition"
               ,(char (*) [62])"failed: expected \"1\"_kj.tryParseAs<unsigned long long>() == 1",
               (DebugComparison<kj::Maybe<unsigned_long_long>,_int> *)&local_98);
  }
LAB_00138327:
  heapString(&local_58,"1",1);
  if ((anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_ !=
      (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x0) {
    local_38 = local_58.content.ptr;
  }
  local_60 = local_58.content.size_ +
             ((anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_58.content.size_ ==
             (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x0);
  _local_68 = local_38;
  StringPtr::tryParseAs<int>((StringPtr *)local_40);
  local_98 = local_40[0];
  sVar2 = local_58.content.size_;
  pcVar1 = local_58.content.ptr;
  bVar3 = local_40[0] == '\x01';
  if (bVar3) {
    local_40[0] = '\0';
    local_94 = (anon_union_4_1_a8c68091_for_NullableValue<float>_2)local_40._4_4_;
  }
  local_90._0_4_ = 1;
  local_88 = " == ";
  local_80 = &DAT_00000005;
  local_78 = CONCAT71(local_78._1_7_,
                      bVar3 && (anon_union_4_1_a8c68091_for_NullableValue<float>_2)local_40._4_4_ ==
                               (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1);
  if (local_58.content.ptr != (char *)0x0) {
    local_58.content.ptr = (char *)0x0;
    local_58.content.size_ = 0;
    (**(local_58.content.disposer)->_vptr_ArrayDisposer)
              (local_58.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((!bVar3 || (anon_union_4_1_a8c68091_for_NullableValue<float>_2)local_40._4_4_ !=
                 (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<int>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xfa,ERROR,
               "\"failed: expected \" \"heapString(\\\"1\\\").tryParseAs<int>() == 1\", _kjCondition"
               ,(char (*) [56])"failed: expected heapString(\"1\").tryParseAs<int>() == 1",
               (DebugComparison<kj::Maybe<int>,_int> *)&local_98);
  }
  return;
}

Assistant:

TEST(String, tryParseAs) {
  KJ_EXPECT("0"_kj.tryParseAs<double>() == 0.0);
  KJ_EXPECT("0"_kj.tryParseAs<double>() == 0.0);
  KJ_EXPECT("0.0"_kj.tryParseAs<double>() == 0.0);
  KJ_EXPECT("1"_kj.tryParseAs<double>() == 1.0);
  KJ_EXPECT("1.0"_kj.tryParseAs<double>() == 1.0);
  KJ_EXPECT("1e100"_kj.tryParseAs<double>() == 1e100);
  KJ_EXPECT("inf"_kj.tryParseAs<double>() == inf());
  KJ_EXPECT("infinity"_kj.tryParseAs<double>() == inf());
  KJ_EXPECT("INF"_kj.tryParseAs<double>() == inf());
  KJ_EXPECT("INFINITY"_kj.tryParseAs<double>() == inf());
  KJ_EXPECT("1e100000"_kj.tryParseAs<double>() == inf());
  KJ_EXPECT("-inf"_kj.tryParseAs<double>() == -inf());
  KJ_EXPECT("-infinity"_kj.tryParseAs<double>() == -inf());
  KJ_EXPECT("-INF"_kj.tryParseAs<double>() == -inf());
  KJ_EXPECT("-INFINITY"_kj.tryParseAs<double>() == -inf());
  KJ_EXPECT("-1e100000"_kj.tryParseAs<double>() == -inf());
  KJ_EXPECT(isNaN("nan"_kj.tryParseAs<double>().orDefault(0.0)) == true);
  KJ_EXPECT(isNaN("NAN"_kj.tryParseAs<double>().orDefault(0.0)) == true);
  KJ_EXPECT(isNaN("NaN"_kj.tryParseAs<double>().orDefault(0.0)) == true);
  KJ_EXPECT(""_kj.tryParseAs<double>() == kj::none);
  KJ_EXPECT("a"_kj.tryParseAs<double>() == kj::none);
  KJ_EXPECT("1a"_kj.tryParseAs<double>() == kj::none);
  KJ_EXPECT("+-1"_kj.tryParseAs<double>() == kj::none);

  KJ_EXPECT("1"_kj.tryParseAs<float>() == 1.0);

  KJ_EXPECT("1"_kj.tryParseAs<int64_t>() == 1);
  KJ_EXPECT("9223372036854775807"_kj.tryParseAs<int64_t>() == 9223372036854775807LL);
  KJ_EXPECT("-9223372036854775808"_kj.tryParseAs<int64_t>() == -9223372036854775808ULL);
  KJ_EXPECT("9223372036854775808"_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT("-9223372036854775809"_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT(""_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT("a"_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT("1a"_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT("+-1"_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT("010"_kj.tryParseAs<int64_t>() == 10);
  KJ_EXPECT("0010"_kj.tryParseAs<int64_t>() == 10);
  KJ_EXPECT("0x10"_kj.tryParseAs<int64_t>() == 16);
  KJ_EXPECT("0X10"_kj.tryParseAs<int64_t>() == 16);
  KJ_EXPECT("-010"_kj.tryParseAs<int64_t>() == -10);
  KJ_EXPECT("-0x10"_kj.tryParseAs<int64_t>() == -16);
  KJ_EXPECT("-0X10"_kj.tryParseAs<int64_t>() == -16);

  KJ_EXPECT("1"_kj.tryParseAs<uint64_t>() == 1);
  KJ_EXPECT("0"_kj.tryParseAs<uint64_t>() == 0);
  KJ_EXPECT("18446744073709551615"_kj.tryParseAs<uint64_t>() == 18446744073709551615ULL);
  KJ_EXPECT("-1"_kj.tryParseAs<uint64_t>() == kj::none);
  KJ_EXPECT("18446744073709551616"_kj.tryParseAs<uint64_t>() == kj::none);
  KJ_EXPECT(""_kj.tryParseAs<uint64_t>() == kj::none);
  KJ_EXPECT("a"_kj.tryParseAs<uint64_t>() == kj::none);
  KJ_EXPECT("1a"_kj.tryParseAs<uint64_t>() == kj::none);
  KJ_EXPECT("+-1"_kj.tryParseAs<uint64_t>() == kj::none);

  KJ_EXPECT("1"_kj.tryParseAs<int32_t>() == 1);
  KJ_EXPECT("2147483647"_kj.tryParseAs<int32_t>() == 2147483647);
  KJ_EXPECT("-2147483648"_kj.tryParseAs<int32_t>() == -2147483648);
  KJ_EXPECT("2147483648"_kj.tryParseAs<int32_t>() == kj::none);
  KJ_EXPECT("-2147483649"_kj.tryParseAs<int32_t>() == kj::none);

  KJ_EXPECT("1"_kj.tryParseAs<uint32_t>() == 1);
  KJ_EXPECT("0"_kj.tryParseAs<uint32_t>() == 0U);
  KJ_EXPECT("4294967295"_kj.tryParseAs<uint32_t>() == 4294967295U);
  KJ_EXPECT("-1"_kj.tryParseAs<uint32_t>() == kj::none);
  KJ_EXPECT("4294967296"_kj.tryParseAs<uint32_t>() == kj::none);

  KJ_EXPECT("1"_kj.tryParseAs<int16_t>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<uint16_t>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<int8_t>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<uint8_t>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<char>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<signed char>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<unsigned char>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<short>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<unsigned short>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<int>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<unsigned>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<long>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<unsigned long>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<long long>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<unsigned long long>() == 1);

  KJ_EXPECT(heapString("1").tryParseAs<int>() == 1);
}